

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlcdnumber.cpp
# Opt level: O3

void __thiscall QLCDNumber::setSegmentStyle(QLCDNumber *this,SegmentStyle s)

{
  long lVar1;
  
  lVar1 = *(long *)&(this->super_QFrame).super_QWidget.field_0x8;
  *(byte *)(lVar1 + 0x288) =
       (s < Flat) << 4 | (s - Filled < 2) << 3 | *(byte *)(lVar1 + 0x288) & 0xe7;
  QWidget::update((QWidget *)this);
  return;
}

Assistant:

void QLCDNumber::setSegmentStyle(SegmentStyle s)
{
    Q_D(QLCDNumber);
    d->fill = (s == Flat || s == Filled);
    d->shadow = (s == Outline || s == Filled);
    update();
}